

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19f5211::ResizeRealtimeTest::PreEncodeFrameHook
          (ResizeRealtimeTest *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  uint uVar2;
  aom_scaling_mode local_20;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(encoder,0x28,3);
    libaom_test::Encoder::Control(encoder,0x61,0);
    libaom_test::Encoder::Control(encoder,0x5f,0);
    libaom_test::Encoder::Control(encoder,0x3d,0);
    libaom_test::Encoder::Control(encoder,0xd,this->set_cpu_used_);
    libaom_test::Encoder::Control(encoder,0x25,1);
    if ((this->super_EncoderTest).cfg_.g_threads != 0) {
      libaom_test::Encoder::Control(encoder,0x20,1);
      libaom_test::Encoder::Control(encoder,0x21,(this->super_EncoderTest).cfg_.g_threads >> 1);
      libaom_test::Encoder::Control(encoder,0x22,0);
    }
    if (this->is_screen_ == true) {
      libaom_test::Encoder::Control(encoder,0x2b,1);
    }
  }
  if (this->set_scale_mode_ == true) {
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (uVar2 < 0x15) {
LAB_006966d7:
      local_20.h_scaling_mode = AOME_ONETWO;
      local_20.v_scaling_mode = AOME_ONETWO;
    }
    else {
      uVar2 = (*video->_vptr_VideoSource[8])(video);
      if (uVar2 < 0x29) {
LAB_0069673f:
        local_20.h_scaling_mode = AOME_ONEFOUR;
        local_20.v_scaling_mode = AOME_ONEFOUR;
      }
      else {
        uVar2 = (*video->_vptr_VideoSource[8])(video);
        if (0x28 < uVar2) {
          local_20.h_scaling_mode = AOME_NORMAL;
          local_20.v_scaling_mode = AOME_NORMAL;
        }
      }
    }
  }
  else if (this->set_scale_mode2_ == true) {
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (uVar2 < 0x15) goto LAB_0069673f;
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (uVar2 < 0x29) goto LAB_006966d7;
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (0x28 < uVar2) {
      local_20.h_scaling_mode = AOME_THREEFOUR;
      local_20.v_scaling_mode = AOME_THREEFOUR;
    }
  }
  else {
    if (this->set_scale_mode3_ != true) goto LAB_00696762;
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    local_20.h_scaling_mode = AOME_ONETWO;
    if (0x1e < uVar2) {
      local_20.h_scaling_mode = AOME_NORMAL;
    }
    local_20.v_scaling_mode = AOME_NORMAL;
  }
  libaom_test::Encoder::Control(encoder,0xb,&local_20);
LAB_00696762:
  if ((this->change_bitrate_ == true) &&
     (uVar2 = (*video->_vptr_VideoSource[8])(video), uVar2 == this->frame_change_bitrate_)) {
    this->change_bitrate_ = false;
    (this->super_EncoderTest).cfg_.rc_target_bitrate = 500;
    libaom_test::Encoder::Config(encoder,&(this->super_EncoderTest).cfg_);
  }
  return;
}

Assistant:

void PreEncodeFrameHook(libaom_test::VideoSource *video,
                          libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_AQ_MODE, 3);
      encoder->Control(AV1E_SET_ALLOW_WARPED_MOTION, 0);
      encoder->Control(AV1E_SET_ENABLE_GLOBAL_MOTION, 0);
      encoder->Control(AV1E_SET_ENABLE_OBMC, 0);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      if (cfg_.g_threads > 0) {
        encoder->Control(AV1E_SET_ROW_MT, 1);
        encoder->Control(AV1E_SET_TILE_COLUMNS, cfg_.g_threads >> 1);
        encoder->Control(AV1E_SET_TILE_ROWS, 0);
      }
      if (is_screen_)
        encoder->Control(AV1E_SET_TUNE_CONTENT, AOM_CONTENT_SCREEN);
    }
    if (set_scale_mode_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 20)
        mode = { AOME_ONETWO, AOME_ONETWO };
      else if (video->frame() <= 40)
        mode = { AOME_ONEFOUR, AOME_ONEFOUR };
      else if (video->frame() > 40)
        mode = { AOME_NORMAL, AOME_NORMAL };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    } else if (set_scale_mode2_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 20)
        mode = { AOME_ONEFOUR, AOME_ONEFOUR };
      else if (video->frame() <= 40)
        mode = { AOME_ONETWO, AOME_ONETWO };
      else if (video->frame() > 40)
        mode = { AOME_THREEFOUR, AOME_THREEFOUR };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    } else if (set_scale_mode3_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 30)
        mode = { AOME_ONETWO, AOME_NORMAL };
      else
        mode = { AOME_NORMAL, AOME_NORMAL };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    }

    if (change_bitrate_ && video->frame() == frame_change_bitrate_) {
      change_bitrate_ = false;
      cfg_.rc_target_bitrate = 500;
      encoder->Config(&cfg_);
    }
  }